

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void anon_unknown.dwarf_ff84f::FinalizeAlignment(TypeStruct *type)

{
  longlong *plVar1;
  MemberHandle *pMVar2;
  long lVar3;
  uint uVar4;
  IntrusiveList<MemberHandle> *pIVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar7 = 0;
  pIVar5 = &type->members;
  while (pMVar2 = pIVar5->head, pMVar2 != (MemberHandle *)0x0) {
    uVar4 = pMVar2->variable->alignment;
    if (uVar7 <= uVar4) {
      uVar7 = uVar4;
    }
    if (pMVar2->variable->type->hasPointers == true) {
      (type->super_TypeBase).hasPointers = true;
    }
    pIVar5 = (IntrusiveList<MemberHandle> *)&pMVar2->next;
  }
  uVar4 = (type->super_TypeBase).alignment;
  if (uVar4 == 0) {
    (type->super_TypeBase).alignment = uVar7;
    uVar4 = uVar7;
  }
  uVar8 = 4;
  if (4 < uVar4) {
    uVar8 = (ulong)uVar4;
  }
  lVar3 = (type->super_TypeBase).size;
  lVar6 = lVar3 % (long)uVar8;
  if (lVar6 != 0) {
    uVar7 = (int)uVar8 - (int)lVar6;
    (type->super_TypeBase).padding = uVar7;
    (type->super_TypeBase).size = lVar3 + (ulong)uVar7;
    plVar1 = &type->typeScope->dataSize;
    *plVar1 = *plVar1 + (ulong)uVar7;
  }
  return;
}

Assistant:

void FinalizeAlignment(TypeStruct *type)
	{
		unsigned maximumAlignment = 0;

		// Additional padding may apply to preserve the alignment of members
		for(MemberHandle *curr = type->members.head; curr; curr = curr->next)
		{
			maximumAlignment = maximumAlignment > curr->variable->alignment ? maximumAlignment : curr->variable->alignment;

			if(curr->variable->type->hasPointers)
				type->hasPointers = true;
		}

		// If explicit alignment is not specified, then class must be aligned to the maximum alignment of the members
		if(type->alignment == 0)
			type->alignment = maximumAlignment;

		// In NULLC, all classes have sizes multiple of 4, so add additional padding if necessary
		maximumAlignment = type->alignment < 4 ? 4 : type->alignment;

		if(type->size % maximumAlignment != 0)
		{
			type->padding = maximumAlignment - (type->size % maximumAlignment);

			type->size += type->padding;
			type->typeScope->dataSize += type->padding;
		}
	}